

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::SequenceNode::increment(SequenceNode *this)

{
  SequenceType SVar1;
  Token *pTVar2;
  Node *pNVar3;
  char *Str;
  Token T;
  Token local_178;
  Twine local_140;
  Token local_128;
  Token local_f0;
  Token local_b8;
  Token local_80;
  Token local_48;
  
  if (*(char *)(*(long *)&((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner + 0x4a) == '\x01') {
    this->IsAtEnd = true;
    this->CurrentEntry = (Node *)0x0;
    return;
  }
  if (this->CurrentEntry != (Node *)0x0) {
    (*this->CurrentEntry->_vptr_Node[1])();
  }
  pTVar2 = Node::peekNext(&this->super_Node);
  Token::Token(&local_178,pTVar2);
  SVar1 = this->SeqType;
  if (SVar1 == ST_Indentless) {
    if (local_178.Kind == TK_BlockEntry) {
      Node::getNext(&local_b8,&this->super_Node);
LAB_0015d059:
      std::__cxx11::string::_M_dispose();
      pNVar3 = Node::parseBlockNode(&this->super_Node);
      this->CurrentEntry = pNVar3;
      if (pNVar3 != (Node *)0x0) goto LAB_0015d12b;
    }
    goto switchD_0015d029_caseD_0;
  }
  if (SVar1 != ST_Flow) {
    if (SVar1 != ST_Block) goto LAB_0015d12b;
    if (local_178.Kind != TK_Error) {
      if (local_178.Kind == TK_BlockEnd) {
        Node::getNext(&local_80,&this->super_Node);
        goto LAB_0015d0ad;
      }
      if (local_178.Kind == TK_BlockEntry) {
        Node::getNext(&local_48,&this->super_Node);
        goto LAB_0015d059;
      }
      Str = "Unexpected token. Expected Block Entry or Block End.";
      goto LAB_0015d107;
    }
    goto switchD_0015d029_caseD_0;
  }
  switch(local_178.Kind) {
  case TK_Error:
    break;
  default:
    if (this->WasPreviousTokenFlowEntry != false) {
      pNVar3 = Node::parseBlockNode(&this->super_Node);
      this->CurrentEntry = pNVar3;
      if (pNVar3 == (Node *)0x0) {
        this->IsAtEnd = true;
      }
      this->WasPreviousTokenFlowEntry = false;
      goto LAB_0015d12b;
    }
    Str = "Expected , between entries!";
    goto LAB_0015d107;
  case TK_StreamEnd:
  case TK_DocumentStart:
  case TK_DocumentEnd:
    Str = "Could not find closing ]!";
LAB_0015d107:
    Twine::Twine(&local_140,Str);
    Node::setError(&this->super_Node,&local_140,&local_178);
    break;
  case TK_FlowEntry:
    Node::getNext(&local_f0,&this->super_Node);
    std::__cxx11::string::_M_dispose();
    this->WasPreviousTokenFlowEntry = true;
    increment(this);
    goto LAB_0015d12b;
  case TK_FlowSequenceEnd:
    Node::getNext(&local_128,&this->super_Node);
LAB_0015d0ad:
    std::__cxx11::string::_M_dispose();
  }
switchD_0015d029_caseD_0:
  this->IsAtEnd = true;
  this->CurrentEntry = (Node *)0x0;
LAB_0015d12b:
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void SequenceNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry)
    CurrentEntry->skip();
  Token T = peekNext();
  if (SeqType == ST_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Block Entry or Block End."
              , T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Indentless) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    default:
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Flow) {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      WasPreviousTokenFlowEntry = true;
      return increment();
    case Token::TK_FlowSequenceEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    case Token::TK_StreamEnd:
    case Token::TK_DocumentEnd:
    case Token::TK_DocumentStart:
      setError("Could not find closing ]!", T);
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      if (!WasPreviousTokenFlowEntry) {
        setError("Expected , between entries!", T);
        IsAtEnd = true;
        CurrentEntry = nullptr;
        break;
      }
      // Otherwise it must be a flow entry.
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) {
        IsAtEnd = true;
      }
      WasPreviousTokenFlowEntry = false;
      break;
    }
  }
}